

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopsubdiv.cpp
# Opt level: O1

SDVertex * __thiscall pbrt::SDFace::otherVert(SDFace *this,SDVertex *v0,SDVertex *v1)

{
  ulong uVar1;
  SDVertex *pSVar2;
  ulong uVar3;
  bool bVar4;
  
  pSVar2 = this->v[0];
  if (pSVar2 == v0 || pSVar2 == v1) {
    uVar1 = 0;
    do {
      uVar3 = uVar1;
      if (uVar3 == 2) break;
      pSVar2 = this->v[uVar3 + 1];
      uVar1 = uVar3 + 1;
    } while (pSVar2 == v1 || pSVar2 == v0);
    bVar4 = 1 < uVar3;
  }
  else {
    bVar4 = false;
  }
  if (!bVar4) {
    return pSVar2;
  }
  LogFatal(Fatal,
           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/loopsubdiv.cpp"
           ,0x44,"Basic logic error in SDVertex::otherVert()");
}

Assistant:

SDVertex *otherVert(SDVertex *v0, SDVertex *v1) {
        for (int i = 0; i < 3; ++i)
            if (v[i] != v0 && v[i] != v1)
                return v[i];
        LOG_FATAL("Basic logic error in SDVertex::otherVert()");
        return nullptr;
    }